

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimalquantity.cpp
# Opt level: O1

UnicodeString * __thiscall
icu_63::number::impl::DecimalQuantity::toString
          (UnicodeString *__return_storage_ptr__,DecimalQuantity *this)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  byte bVar4;
  ulong uVar5;
  ulong uVar6;
  char *pcVar7;
  char *pcVar8;
  MaybeStackArray<char,_30> digits;
  char buffer8 [100];
  
  MaybeStackArray<char,_30>::MaybeStackArray(&digits,this->precision + 1);
  uVar2 = this->precision;
  uVar5 = (ulong)uVar2;
  if (0 < (int)uVar2) {
    iVar1 = -1;
    lVar3 = 0;
    do {
      uVar2 = (int)uVar5 + iVar1;
      if (this->usingBytes == true) {
        if ((int)uVar2 < (int)uVar5 && -1 < (int)uVar2) {
          bVar4 = (this->fBCD).bcdBytes.ptr[uVar2];
        }
        else {
LAB_00210c43:
          bVar4 = 0;
        }
      }
      else {
        if (0xf < uVar2) goto LAB_00210c43;
        bVar4 = (byte)((this->fBCD).bcdLong >> ((char)uVar2 * '\x04' & 0x3fU)) & 0xf;
      }
      digits.ptr[lVar3] = bVar4 + 0x30;
      lVar3 = lVar3 + 1;
      uVar2 = this->precision;
      uVar5 = (ulong)(int)uVar2;
      iVar1 = iVar1 + -1;
    } while (lVar3 < (long)uVar5);
  }
  digits.ptr[(int)uVar2] = '\0';
  uVar5 = 999;
  if (this->lOptPos < 999) {
    uVar5 = (ulong)(uint)this->lOptPos;
  }
  uVar6 = 0xfffffc19;
  if (-999 < this->rOptPos) {
    uVar6 = (ulong)(uint)this->rOptPos;
  }
  pcVar8 = "long";
  if (this->usingBytes != false) {
    pcVar8 = "bytes";
  }
  pcVar7 = "-";
  if ((this->flags & 1U) == 0) {
    pcVar7 = "";
  }
  if (this->precision == 0) {
    digits.ptr = "0";
  }
  snprintf(buffer8,100,"<DecimalQuantity %d:%d:%d:%d %s %s%s%s%d>",uVar5,(ulong)(uint)this->lReqPos,
           (ulong)(uint)this->rReqPos,uVar6,pcVar8,pcVar7,digits.ptr,"E",(ulong)(uint)this->scale);
  UnicodeString::UnicodeString(__return_storage_ptr__,buffer8,-1,kInvariant);
  MaybeStackArray<char,_30>::~MaybeStackArray(&digits);
  return __return_storage_ptr__;
}

Assistant:

UnicodeString DecimalQuantity::toString() const {
    MaybeStackArray<char, 30> digits(precision + 1);
    for (int32_t i = 0; i < precision; i++) {
        digits[i] = getDigitPos(precision - i - 1) + '0';
    }
    digits[precision] = 0; // terminate buffer
    char buffer8[100];
    snprintf(
            buffer8,
            sizeof(buffer8),
            "<DecimalQuantity %d:%d:%d:%d %s %s%s%s%d>",
            (lOptPos > 999 ? 999 : lOptPos),
            lReqPos,
            rReqPos,
            (rOptPos < -999 ? -999 : rOptPos),
            (usingBytes ? "bytes" : "long"),
            (isNegative() ? "-" : ""),
            (precision == 0 ? "0" : digits.getAlias()),
            "E",
            scale);
    return UnicodeString(buffer8, -1, US_INV);
}